

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O3

int mem_write(int hdl,void *buffer,long nbytes)

{
  memdriver *pmVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  
  pmVar1 = memTable + hdl;
  lVar4 = memTable[hdl].currentpos;
  if (*memTable[hdl].memsizeptr < (ulong)(lVar4 + nbytes)) {
    if (memTable[hdl].mem_realloc == (_func_void_ptr_void_ptr_size_t *)0x0) {
      ffpmsg("realloc function not defined (mem_write)");
      return 0x6a;
    }
    uVar2 = ((long)((lVar4 + nbytes) - 1U) / 0xb40) * 0xb40 + 0xb40;
    uVar5 = *memTable[hdl].memsizeptr + memTable[hdl].deltasize;
    if (uVar5 < uVar2) {
      uVar5 = uVar2;
    }
    pcVar3 = (char *)(*memTable[hdl].mem_realloc)(*pmVar1->memaddrptr,uVar5);
    if (pcVar3 == (char *)0x0) {
      ffpmsg("Failed to reallocate memory (mem_write)");
      return 0x71;
    }
    *pmVar1->memaddrptr = pcVar3;
    *memTable[hdl].memsizeptr = uVar5;
    lVar4 = memTable[hdl].currentpos;
  }
  memcpy(*pmVar1->memaddrptr + lVar4,buffer,nbytes);
  lVar4 = nbytes + memTable[hdl].currentpos;
  memTable[hdl].currentpos = lVar4;
  if (lVar4 < memTable[hdl].fitsfilesize) {
    lVar4 = memTable[hdl].fitsfilesize;
  }
  memTable[hdl].fitsfilesize = lVar4;
  return 0;
}

Assistant:

int mem_write(int hdl, void *buffer, long nbytes)
/*
  write bytes at the current position in the file
*/
{
    size_t newsize;
    char *ptr;

    if ((size_t) (memTable[hdl].currentpos + nbytes) > 
         *(memTable[hdl].memsizeptr) )
    {
               
        if (!(memTable[hdl].mem_realloc))
        {
            ffpmsg("realloc function not defined (mem_write)");
            return(WRITE_ERROR);
        }

        /*
          Attempt to reallocate additional memory:
          the memory buffer size is incremented by the larger of:
             1 FITS block (2880 bytes) or
             the defined 'deltasize' parameter
         */

        newsize = maxvalue( (size_t)
            (((memTable[hdl].currentpos + nbytes - 1) / 2880) + 1) * 2880,
            *(memTable[hdl].memsizeptr) + memTable[hdl].deltasize);

        /* call the realloc function */
        ptr = (memTable[hdl].mem_realloc)(
                                    *(memTable[hdl].memaddrptr),
                                     newsize);
        if (!ptr)
        {
            ffpmsg("Failed to reallocate memory (mem_write)");
            return(MEMORY_ALLOCATION);
        }

        *(memTable[hdl].memaddrptr) = ptr;
        *(memTable[hdl].memsizeptr) = newsize;
    }

    /* now copy the bytes from the buffer into memory */
    memcpy( *(memTable[hdl].memaddrptr) + memTable[hdl].currentpos,
             buffer,
             nbytes);

    memTable[hdl].currentpos += nbytes;
    memTable[hdl].fitsfilesize =
               maxvalue(memTable[hdl].fitsfilesize,
                        memTable[hdl].currentpos);
    return(0);
}